

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

DeviceData * __thiscall
QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData>::value
          (DeviceData *__return_storage_ptr__,
          QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData> *this,QPaintDevice **key)

{
  DeviceData *pDVar1;
  
  pDVar1 = QHash<QPaintDevice*,QGraphicsItemCache::DeviceData>::valueImpl<QPaintDevice*>
                     ((QHash<QPaintDevice*,QGraphicsItemCache::DeviceData> *)this,key);
  if (pDVar1 == (DeviceData *)0x0) {
    QGraphicsItemCache::DeviceData::DeviceData(__return_storage_ptr__);
  }
  else {
    QGraphicsItemCache::DeviceData::DeviceData(__return_storage_ptr__,pDVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }